

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_TextExtra::Write(ON_OBSOLETE_V5_TextExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_parent_uuid);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteBool(archive,this->m_bDrawMask);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_color_source);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_mask_color);
          if (bVar1) {
            bVar2 = ON_BinaryArchive::WriteDouble(archive,this->m_border_offset);
            goto LAB_004a0c68;
          }
        }
      }
    }
    bVar2 = false;
  }
LAB_004a0c68:
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_OBSOLETE_V5_TextExtra::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);

  if(rc) rc = archive.WriteUuid(m_parent_uuid);
  if(rc) rc = archive.WriteBool(m_bDrawMask);
  if(rc) rc = archive.WriteInt(m_color_source);
  if(rc) rc = archive.WriteColor(m_mask_color);
  if(rc) rc = archive.WriteDouble(m_border_offset);

  if(!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}